

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# craigtracer.cpp
# Opt level: O3

CraigCnfType __thiscall
CaDiCraig::CraigTracer::create_craig_interpolant
          (CraigTracer *this,CraigInterpolant interpolant,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *cnf,int *nextFreeVariable)

{
  CraigConstruction CVar1;
  undefined8 *puVar2;
  int *__args;
  undefined8 uVar3;
  void *pvVar4;
  CraigConstruction CVar5;
  CraigCnfType CVar6;
  undefined7 extraout_var;
  bool bVar7;
  CraigInterpolant CVar11;
  ulong uVar8;
  uint *puVar9;
  long lVar10;
  vector<int,_std::allocator<int>_> *extraout_RDX;
  vector<int,_std::allocator<int>_> *cnf_00;
  byte bVar12;
  tuple<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
  *it;
  CraigCnfType *pCVar13;
  CraigData *root;
  Aig *this_00;
  CraigCnfType *pCVar14;
  CraigCnfType *pCVar15;
  CraigCnfType unaff_R12B;
  byte bVar16;
  long lVar17;
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  *pvVar18;
  int iVar19;
  char unaff_R14B;
  byte bVar20;
  uint uVar21;
  char unaff_R15B;
  long lVar22;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  vector<int,_std::allocator<int>_> craig_trigger_clause;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  craig_cnf_dual_sym;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  craig_cnf_dual_asym;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  craig_cnf_asym;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  craig_cnf_sym;
  allocator_type aStack_139;
  vector<int,_std::allocator<int>_> local_138;
  uint *local_118;
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  *local_110;
  vector<int,_std::allocator<int>_> vStack_108;
  undefined8 local_f0;
  uint uStack_e4;
  CraigCnfType *local_e0;
  CraigCnfType *pCStack_d8;
  CraigCnfType *pCStack_d0;
  long lStack_c8;
  vector<int,_std::allocator<int>_> local_b8;
  vector<int,_std::allocator<int>_> local_98;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_58;
  ulong uStack_38;
  
  this_00 = (Aig *)cnf;
  local_118 = (uint *)nextFreeVariable;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_erase_at_end(cnf,(cnf->
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start);
  root = this->craig_interpolant;
  if (root == (CraigData *)0x0) {
    return NONE;
  }
  local_e0 = (CraigCnfType *)(ulong)interpolant;
  uVar8 = (ulong)(int)(&switchD_007ded8f::switchdataD_0091d630)[(long)local_e0];
  puVar9 = (uint *)((long)&switchD_007ded8f::switchdataD_0091d630 + uVar8);
  CVar11 = (CraigInterpolant)((ulong)puVar9 >> 8);
  CVar6 = (CraigCnfType)this;
  local_110 = (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
               *)cnf;
  switch(puVar9) {
  case (uint *)0x7ded91:
    CVar1 = this->craig_construction;
    CVar5 = CVar1 & SYMMETRIC;
    bVar20 = (CVar1 & ASYMMETRIC) >> 1;
    bVar16 = (CVar1 & DUAL_SYMMETRIC) >> 2;
    bVar12 = (CVar1 & DUAL_ASYMMETRIC) >> 3;
LAB_007dee02:
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    if (CVar5 != NONE) {
      Aig::create_cnf(this->craig_aig_sym,&root->partial_interpolant_sym,
                      (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       *)&local_58,(int *)local_118);
    }
    if (bVar20 == 0) {
      local_f0 = (CraigCnfType *)((ulong)local_f0._4_4_ << 0x20);
    }
    else {
      CVar6 = Aig::create_cnf(this->craig_aig_asym,
                              &this->craig_interpolant->partial_interpolant_asym,
                              (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)&local_78,(int *)local_118);
      local_f0 = (CraigCnfType *)CONCAT44(local_f0._4_4_,(int)CONCAT71(extraout_var,CVar6));
    }
    if (bVar16 == 0) {
      unaff_R12B = NONE;
    }
    else {
      unaff_R12B = Aig::create_cnf(this->craig_aig_dual_sym,
                                   &this->craig_interpolant->partial_interpolant_dual_sym,
                                   (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    *)&local_b8,(int *)local_118);
    }
    if (bVar12 != 0) {
      this_00 = this->craig_aig_dual_asym;
      root = (CraigData *)&this->craig_interpolant->partial_interpolant_dual_asym;
      cnf_00 = &local_98;
      puVar9 = local_118;
code_r0x007deef3:
      Aig::create_cnf(this_00,&root->partial_interpolant_sym,
                      (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       *)cnf_00,(int *)puVar9);
    }
    CVar6 = (*(code *)((long)&UINT_0091d654 + (long)(int)(&UINT_0091d654)[unaff_R12B]))();
    return CVar6;
  case (uint *)0x7dedc1:
    bVar12 = (this->craig_construction & DUAL_ASYMMETRIC) >> 3;
LAB_007dedfa:
    bVar16 = 0;
LAB_007dedfd:
    bVar20 = 0;
LAB_007dee00:
    CVar5 = NONE;
    goto LAB_007dee02;
  case (uint *)0x7dedd0:
    bVar20 = (this->craig_construction & ASYMMETRIC) >> 1;
    bVar12 = 0;
    bVar16 = 0;
    goto LAB_007dee00;
  case (uint *)0x7dede5:
    bVar16 = (this->craig_construction & DUAL_SYMMETRIC) >> 2;
    bVar12 = 0;
    goto LAB_007dedfd;
  case (uint *)0x7dedf8:
    bVar12 = 0;
    goto LAB_007dedfa;
  case (uint *)0x7deef0:
    cnf_00 = extraout_RDX;
    goto code_r0x007deef3;
  case (uint *)0x7deef5:
    if (uVar8 == 0xffffffffff6e29d1 || puVar9 == (uint *)0x0) {
      *(int *)("% SZS output end FiniteModel for " + uVar8 + 0x13) =
           *(int *)("% SZS output end FiniteModel for " + uVar8 + 0x13) + 1;
      halt_baddata();
    }
    halt_baddata();
  case (uint *)0x7def37:
    if (puVar9 == (uint *)0x0) {
      switchD_007ded8f::switchdataD_0091d630._0_1_ = 0xf8;
      anon_var_dwarf_2b5728a[0x16] = (byte)puVar9 + 'e';
      func_0xffffffffb4bf0862();
      halt_baddata();
    }
    uRam10247c8b48000037 = (undefined4)CONCAT71(0x91d6,CVar11 + 0x30 + (0xffffffffff6e29cf < uVar8))
    ;
    if (this_00 != (Aig *)0x0) {
      operator_delete(this_00,(long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage - (long)this_00);
    }
    unaff_R12B = CONSTANT0;
    unaff_R14B = '\0';
    CVar11 = interpolant;
    goto code_r0x007def8c;
  case (uint *)0x7def4d:
    UINT_0091d658._1_1_ = (byte)puVar9 & 0x19;
    halt_baddata();
  case (uint *)0x7def73:
    DAT_0091d610 = 0x11;
    *(char *)puVar9 = (char)*puVar9 + (char)((ulong)extraout_RDX >> 8);
    halt_baddata();
  case (uint *)0x7def89:
code_r0x007def8c:
    if (CVar11 < INTERSECTION) {
      CVar6 = (*(code *)((long)&UINT_0091d664 + (long)(int)(&UINT_0091d664)[(long)local_e0]))();
      return CVar6;
    }
    pCStack_d8 = (CraigCnfType *)0x0;
    pCStack_d0 = (CraigCnfType *)0x0;
    lStack_c8 = 0;
    if (unaff_R15B != '\0') {
      local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT71(local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._1_7_,unaff_R15B);
      local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)&local_58;
      std::
      vector<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>,std::allocator<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>>
      ::
      emplace_back<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>
                ((vector<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>,std::allocator<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>>
                  *)&pCStack_d8,
                 (tuple<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                  *)&local_138);
    }
    if ((char)local_f0 != '\0') {
      local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT71(local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._1_7_,(char)local_f0);
      local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)&local_78;
      std::
      vector<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>,std::allocator<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>>
      ::
      emplace_back<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>
                ((vector<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>,std::allocator<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>>
                  *)&pCStack_d8,
                 (tuple<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                  *)&local_138);
    }
    if (unaff_R14B == '\0') {
      local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT71(local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._1_7_,unaff_R12B);
      local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)&local_b8;
      std::
      vector<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>,std::allocator<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>>
      ::
      emplace_back<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>
                ((vector<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>,std::allocator<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>>
                  *)&pCStack_d8,
                 (tuple<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                  *)&local_138);
    }
    pvVar18 = local_110;
    if (CVar6 != NONE) {
      local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT71(local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._1_7_,CVar6);
      local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)&local_98;
      std::
      vector<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>,std::allocator<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>>
      ::
      emplace_back<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>
                ((vector<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>,std::allocator<std::tuple<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*,CaDiCraig::CraigCnfType>>>
                  *)&pCStack_d8,
                 (tuple<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_*,_CaDiCraig::CraigCnfType>
                  *)&local_138);
    }
    lVar10 = (long)pCStack_d0 - (long)pCStack_d8 >> 4;
    if (lVar10 == 0) {
      unaff_R12B = NONE;
      goto LAB_007df82b;
    }
    if (lVar10 == 1) {
      puVar2 = *(undefined8 **)(pCStack_d8 + 8);
      local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = *(pointer *)(pvVar18 + 0x10);
      uVar3 = puVar2[1];
      local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)pvVar18;
      local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = *(pointer *)(pvVar18 + 8);
      *(undefined8 *)pvVar18 = *puVar2;
      *(undefined8 *)(pvVar18 + 8) = uVar3;
      *(undefined8 *)(pvVar18 + 0x10) = puVar2[2];
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2[2] = 0;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&local_138);
      unaff_R12B = *pCStack_d8;
    }
    else {
      pCVar14 = pCStack_d8;
      if (interpolant == SMALLEST) {
        pCVar13 = pCStack_d8 + 0x10;
        pCVar15 = pCStack_d8;
        if (pCVar13 != pCStack_d0 && pCStack_d8 != pCStack_d0) {
          do {
            pCVar14 = pCVar13;
            if ((ulong)((*(long **)(pCVar15 + 8))[1] - **(long **)(pCVar15 + 8)) <=
                (ulong)((*(long **)(pCVar13 + 8))[1] - **(long **)(pCVar13 + 8))) {
              pCVar14 = pCVar15;
            }
            pCVar13 = pCVar13 + 0x10;
            pCVar15 = pCVar14;
          } while (pCVar13 != pCStack_d0);
        }
LAB_007df38b:
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator=((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)pvVar18,
                    *(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      **)(pCVar14 + 8));
        unaff_R12B = *pCVar14;
      }
      else if ((int)local_e0 == 6) {
        if (pCStack_d8 != pCStack_d0) {
          bVar7 = true;
          do {
            if (*pCVar14 == CONSTANT0) {
              puVar2 = *(undefined8 **)(pCVar14 + 8);
              local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = *(pointer *)(pvVar18 + 0x10);
              uVar3 = puVar2[1];
              local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = *(pointer *)pvVar18;
              local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = *(pointer *)(pvVar18 + 8);
              *(undefined8 *)pvVar18 = *puVar2;
              *(undefined8 *)(pvVar18 + 8) = uVar3;
              *(undefined8 *)(pvVar18 + 0x10) = puVar2[2];
              *puVar2 = 0;
              puVar2[1] = 0;
              puVar2[2] = 0;
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)&local_138);
              goto LAB_007df3dd;
            }
            bVar7 = (bool)(bVar7 & *pCVar14 == CONSTANT1);
            pCVar14 = pCVar14 + 0x10;
          } while (pCVar14 != pCStack_d0);
          if (!bVar7) {
            vStack_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start._0_4_ = *local_118;
            uStack_38 = (ulong)(uint)vStack_108.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start;
            *local_118 = (uint)vStack_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + 1;
            __l._M_len = 1;
            __l._M_array = (iterator)&vStack_108;
            std::vector<int,_std::allocator<int>_>::vector
                      (&local_138,__l,(allocator_type *)&uStack_e4);
            if (pCStack_d8 != pCStack_d0) {
              iVar19 = -(int)uStack_38;
              local_e0 = pCStack_d0;
              local_f0 = (CraigCnfType *)CONCAT44(local_f0._4_4_,iVar19);
              pCVar14 = pCStack_d8;
              pCVar13 = pCStack_d0;
              do {
                if (*pCVar14 == NORMAL) {
                  lVar17 = *(long *)(pvVar18 + 8) - *(long *)pvVar18 >> 3;
                  puVar9 = (uint *)(lVar17 * -0x5555555555555555);
                  std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            *)pvVar18,
                           ((*(long **)(pCVar14 + 8))[1] - **(long **)(pCVar14 + 8) >> 3) *
                           -0x5555555555555555 + (long)puVar9);
                  lVar10 = **(long **)(pCVar14 + 8);
                  if ((*(long **)(pCVar14 + 8))[1] - lVar10 == 0x18) {
                    uVar8 = 0;
                  }
                  else {
                    lVar22 = 0;
                    uVar8 = 0;
                    local_118 = puVar9;
                    do {
                      std::vector<int,_std::allocator<int>_>::_M_move_assign
                                ((vector<int,_std::allocator<int>_> *)
                                 (*(long *)pvVar18 + lVar17 * 8 + lVar22),lVar10 + lVar22);
                      uVar8 = uVar8 + 1;
                      lVar10 = **(long **)(pCVar14 + 8);
                      lVar22 = lVar22 + 0x18;
                    } while (uVar8 < ((*(long **)(pCVar14 + 8))[1] - lVar10 >> 3) *
                                     -0x5555555555555555 - 1U);
                    puVar9 = (uint *)((long)local_118 + uVar8);
                    pCVar13 = local_e0;
                    iVar19 = (int)local_f0;
                  }
                  vStack_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start._4_4_ = **(int **)(lVar10 + uVar8 * 0x18);
                  vStack_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start._0_4_ = iVar19;
                  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                            ((vector<int,std::allocator<int>> *)
                             ((long)puVar9 * 0x18 + *(long *)pvVar18),&vStack_108,
                             &vStack_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish);
                  vStack_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start._0_4_ =
                       -**(int **)(**(long **)(pCVar14 + 8) + uVar8 * 0x18);
                  if (local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              (&local_138,
                               (iterator)
                               local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish,(int *)&vStack_108);
                  }
                  else {
                    *local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish =
                         (uint)vStack_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start;
                    local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                }
                pCVar14 = pCVar14 + 0x10;
              } while (pCVar14 != pCVar13);
            }
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)pvVar18,&local_138);
            uStack_e4 = (uint)uStack_38;
            __l_00._M_len = 1;
            __l_00._M_array = (iterator)&uStack_e4;
            std::vector<int,_std::allocator<int>_>::vector(&vStack_108,__l_00,&aStack_139);
            std::
            vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
            ::emplace_back<std::vector<int,std::allocator<int>>>(pvVar18,&vStack_108);
LAB_007df7f5:
            pvVar4 = (void *)CONCAT44(vStack_108.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (uint)vStack_108.super__Vector_base<int,_std::allocator<int>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
            if (pvVar4 != (void *)0x0) {
              operator_delete(pvVar4,(long)vStack_108.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)pvVar4);
            }
            if (local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            unaff_R12B = NORMAL;
            goto LAB_007df82b;
          }
        }
        unaff_R12B = CONSTANT1;
        std::
        vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
        ::_M_assign_aux<std::vector<int,std::allocator<int>>const*>(pvVar18,0,0);
      }
      else {
        if ((int)local_e0 != 5) {
          pCVar13 = pCStack_d8 + 0x10;
          pCVar15 = pCStack_d8;
          if (pCVar13 != pCStack_d0 && pCStack_d8 != pCStack_d0) {
            do {
              pCVar14 = pCVar13;
              if ((ulong)((*(long **)(pCVar13 + 8))[1] - **(long **)(pCVar13 + 8)) <=
                  (ulong)((*(long **)(pCVar15 + 8))[1] - **(long **)(pCVar15 + 8))) {
                pCVar14 = pCVar15;
              }
              pCVar13 = pCVar13 + 0x10;
              pCVar15 = pCVar14;
            } while (pCVar13 != pCStack_d0);
          }
          goto LAB_007df38b;
        }
        if (pCStack_d8 != pCStack_d0) {
          bVar7 = true;
          do {
            if (*pCVar14 == CONSTANT1) {
              puVar2 = *(undefined8 **)(pCVar14 + 8);
              local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = *(pointer *)(pvVar18 + 0x10);
              uVar3 = puVar2[1];
              local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = *(pointer *)pvVar18;
              local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = *(pointer *)(pvVar18 + 8);
              *(undefined8 *)pvVar18 = *puVar2;
              *(undefined8 *)(pvVar18 + 8) = uVar3;
              *(undefined8 *)(pvVar18 + 0x10) = puVar2[2];
              *puVar2 = 0;
              puVar2[1] = 0;
              puVar2[2] = 0;
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)&local_138);
              unaff_R12B = CONSTANT1;
              goto LAB_007df82b;
            }
            bVar7 = (bool)(bVar7 & *pCVar14 == CONSTANT0);
            pCVar14 = pCVar14 + 0x10;
          } while (pCVar14 != pCStack_d0);
          if (!bVar7) {
            uVar21 = *local_118;
            pCVar14 = (CraigCnfType *)(ulong)uVar21;
            *local_118 = uVar21 + 1;
            vStack_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start._0_4_ = -uVar21;
            __l_01._M_len = 1;
            __l_01._M_array = (iterator)&vStack_108;
            std::vector<int,_std::allocator<int>_>::vector
                      (&local_138,__l_01,(allocator_type *)&uStack_e4);
            if (pCStack_d8 != pCStack_d0) {
              local_f0 = pCStack_d0;
              pCVar13 = pCStack_d8;
              pCVar15 = pCStack_d0;
              local_e0 = pCVar14;
              do {
                if (*pCVar13 == NORMAL) {
                  lVar17 = (long)*(pointer *)(pvVar18 + 8) - *(long *)pvVar18 >> 3;
                  puVar9 = (uint *)(lVar17 * -0x5555555555555555);
                  std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            *)pvVar18,
                           ((*(long **)(pCVar13 + 8))[1] - **(long **)(pCVar13 + 8) >> 3) *
                           -0x5555555555555555 + (long)puVar9);
                  pvVar18 = local_110;
                  lVar10 = **(long **)(pCVar13 + 8);
                  if ((*(long **)(pCVar13 + 8))[1] - lVar10 == 0x18) {
                    uVar8 = 0;
                  }
                  else {
                    lVar22 = 0;
                    uVar8 = 0;
                    local_118 = puVar9;
                    do {
                      std::vector<int,_std::allocator<int>_>::_M_move_assign
                                ((vector<int,_std::allocator<int>_> *)
                                 (*(long *)pvVar18 + lVar17 * 8 + lVar22),lVar10 + lVar22);
                      uVar8 = uVar8 + 1;
                      lVar10 = **(long **)(pCVar13 + 8);
                      lVar22 = lVar22 + 0x18;
                    } while (uVar8 < ((*(long **)(pCVar13 + 8))[1] - lVar10 >> 3) *
                                     -0x5555555555555555 - 1U);
                    puVar9 = (uint *)((long)local_118 + uVar8);
                    pCVar14 = local_e0;
                    pCVar15 = local_f0;
                  }
                  __args = *(int **)(lVar10 + uVar8 * 0x18);
                  if (local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)&local_138,
                               (iterator)
                               local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish,__args);
                  }
                  else {
                    *local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish = *__args;
                    local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                  pvVar18 = local_110;
                  vStack_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start._0_4_ = (uint)pCVar14;
                  vStack_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start._4_4_ =
                       -**(int **)(**(long **)(pCVar13 + 8) + uVar8 * 0x18);
                  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                            ((vector<int,std::allocator<int>> *)
                             ((long)puVar9 * 0x18 + *(long *)local_110),&vStack_108,
                             &vStack_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish);
                }
                uVar21 = (uint)pCVar14;
                pCVar13 = pCVar13 + 0x10;
              } while (pCVar13 != pCVar15);
            }
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)pvVar18,&local_138);
            __l_02._M_len = 1;
            __l_02._M_array = (iterator)&uStack_e4;
            uStack_e4 = uVar21;
            std::vector<int,_std::allocator<int>_>::vector(&vStack_108,__l_02,&aStack_139);
            std::
            vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
            ::emplace_back<std::vector<int,std::allocator<int>>>(pvVar18,&vStack_108);
            goto LAB_007df7f5;
          }
        }
        local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
        ::_M_assign_aux<std::vector<int,std::allocator<int>>const*>(pvVar18,&local_138);
        if (local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
LAB_007df3dd:
        unaff_R12B = CONSTANT0;
      }
LAB_007df82b:
      if (pCStack_d8 == (CraigCnfType *)0x0) break;
    }
    operator_delete(pCStack_d8,lStack_c8 - (long)pCStack_d8);
    break;
  case (uint *)0x7defdc:
    *(int *)&(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&extraout_RDX->super__Vector_base<int,_std::allocator<int>_>)->_M_impl).
             super__Vector_impl_data._M_start =
         *(int *)&(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)&extraout_RDX->super__Vector_base<int,_std::allocator<int>_>)->_M_impl).
                  super__Vector_impl_data._M_start + 0x91d630;
    local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)CONCAT44(in_XMM1_Db,in_XMM1_Da);
    local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)CONCAT44(in_XMM1_Dd,in_XMM1_Dc);
    local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)&switchD_007ded8f::switchdataD_0091d630;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&local_138);
    unaff_R12B = CVar6;
    break;
  case (uint *)0x7df033:
    local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)CONCAT44(in_XMM1_Db,in_XMM1_Da);
    local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)CONCAT44(in_XMM1_Dd,in_XMM1_Dc);
    local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)&switchD_007ded8f::switchdataD_0091d630;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&local_138);
    unaff_R12B = (CraigCnfType)local_f0;
    break;
  case (uint *)0x7df086:
    *(int *)&(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&extraout_RDX->super__Vector_base<int,_std::allocator<int>_>)->_M_impl).
             super__Vector_impl_data._M_start =
         *(int *)&(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)&extraout_RDX->super__Vector_base<int,_std::allocator<int>_>)->_M_impl).
                  super__Vector_impl_data._M_start + 0x91d630;
    local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)CONCAT44(in_XMM1_Db,in_XMM1_Da);
    local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)CONCAT44(in_XMM1_Dd,in_XMM1_Dc);
    local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)&switchD_007ded8f::switchdataD_0091d630;
    local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&local_138);
    break;
  case (uint *)0x7df218:
    CVar5 = this->craig_construction & SYMMETRIC;
    bVar12 = 0;
    bVar16 = 0;
    bVar20 = 0;
    goto LAB_007dee02;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_98);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_b8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_78);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_58);
  return unaff_R12B;
}

Assistant:

CraigCnfType
CraigTracer::create_craig_interpolant (CraigInterpolant interpolant,
                                       std::vector<std::vector<int>> &cnf,
                                       int &nextFreeVariable) {
  cnf.clear ();

  if (!has_craig_interpolant ()) {
    return CraigCnfType::NONE;
  }

  bool build_cnf_sym = false;
  bool build_cnf_asym = false;
  bool build_cnf_dual_sym = false;
  bool build_cnf_dual_asym = false;
  switch (interpolant) {
  case CraigInterpolant::NONE:
    break;
  case CraigInterpolant::SYMMETRIC:
    build_cnf_sym = is_construction_enabled (CraigConstruction::SYMMETRIC);
    break;
  case CraigInterpolant::ASYMMETRIC:
    build_cnf_asym =
        is_construction_enabled (CraigConstruction::ASYMMETRIC);
    break;
  case CraigInterpolant::DUAL_SYMMETRIC:
    build_cnf_dual_sym =
        is_construction_enabled (CraigConstruction::DUAL_SYMMETRIC);
    break;
  case CraigInterpolant::DUAL_ASYMMETRIC:
    build_cnf_dual_asym =
        is_construction_enabled (CraigConstruction::DUAL_ASYMMETRIC);
    break;
  case CraigInterpolant::INTERSECTION:
  case CraigInterpolant::UNION:
  case CraigInterpolant::SMALLEST:
  case CraigInterpolant::LARGEST:
    build_cnf_sym = is_construction_enabled (CraigConstruction::SYMMETRIC);
    build_cnf_asym =
        is_construction_enabled (CraigConstruction::ASYMMETRIC);
    build_cnf_dual_sym =
        is_construction_enabled (CraigConstruction::DUAL_SYMMETRIC);
    build_cnf_dual_asym =
        is_construction_enabled (CraigConstruction::DUAL_ASYMMETRIC);
    break;

  default:
    assert (false); // Seleted craig interpolation type not supported!
    __builtin_unreachable ();
  }

  std::vector<std::vector<int>> craig_cnf_sym;
  std::vector<std::vector<int>> craig_cnf_asym;
  std::vector<std::vector<int>> craig_cnf_dual_sym;
  std::vector<std::vector<int>> craig_cnf_dual_asym;
  CraigCnfType craig_cnf_type_sym = CraigCnfType::NONE;
  CraigCnfType craig_cnf_type_asym = CraigCnfType::NONE;
  CraigCnfType craig_cnf_type_dual_sym = CraigCnfType::NONE;
  CraigCnfType craig_cnf_type_dual_asym = CraigCnfType::NONE;

  if (build_cnf_sym)
    craig_cnf_type_sym = craig_aig_sym->create_cnf (
        craig_interpolant->partial_interpolant_sym, craig_cnf_sym,
        nextFreeVariable);
  if (build_cnf_asym)
    craig_cnf_type_asym = craig_aig_asym->create_cnf (
        craig_interpolant->partial_interpolant_asym, craig_cnf_asym,
        nextFreeVariable);
  if (build_cnf_dual_sym)
    craig_cnf_type_dual_sym = craig_aig_dual_sym->create_cnf (
        craig_interpolant->partial_interpolant_dual_sym, craig_cnf_dual_sym,
        nextFreeVariable);
  if (build_cnf_dual_asym)
    craig_cnf_type_dual_asym = craig_aig_dual_asym->create_cnf (
        craig_interpolant->partial_interpolant_dual_asym,
        craig_cnf_dual_asym, nextFreeVariable);

  // Dual Craig interpolants have to be inverted.
  // However, the construction rules for the dual asymmetric interpolant
  // already incorporates the negation. So only the dual symmetric
  // interpolant needs to be negated.
  if (craig_cnf_type_dual_sym == CraigCnfType::CONSTANT1) {
    craig_cnf_dual_sym = {{}};
    craig_cnf_type_dual_sym = CraigCnfType::CONSTANT0;
  } else if (craig_cnf_type_dual_sym == CraigCnfType::CONSTANT0) {
    craig_cnf_dual_sym = {};
    craig_cnf_type_dual_sym = CraigCnfType::CONSTANT1;
  } else if (craig_cnf_type_dual_sym == CraigCnfType::NORMAL) {
    craig_cnf_dual_sym.back ()[0] = -craig_cnf_dual_sym.back ()[0];
  }

  if (interpolant == CraigInterpolant::NONE) {
    cnf = {};
    return CraigCnfType::NONE;
  } else if (interpolant == CraigInterpolant::SYMMETRIC) {
    cnf = std::move (craig_cnf_sym);
    return craig_cnf_type_sym;
  } else if (interpolant == CraigInterpolant::ASYMMETRIC) {
    cnf = std::move (craig_cnf_asym);
    return craig_cnf_type_asym;
  } else if (interpolant == CraigInterpolant::DUAL_SYMMETRIC) {
    cnf = std::move (craig_cnf_dual_sym);
    return craig_cnf_type_dual_sym;
  } else if (interpolant == CraigInterpolant::DUAL_ASYMMETRIC) {
    cnf = std::move (craig_cnf_dual_asym);
    return craig_cnf_type_dual_asym;
  }

  std::vector<std::tuple<std::vector<std::vector<int>> *, CraigCnfType>>
      craig_cnfs{};
  if (craig_cnf_type_sym != CraigCnfType::NONE)
    craig_cnfs.push_back ({&craig_cnf_sym, craig_cnf_type_sym});
  if (craig_cnf_type_asym != CraigCnfType::NONE)
    craig_cnfs.push_back ({&craig_cnf_asym, craig_cnf_type_asym});
  if (craig_cnf_type_dual_sym != CraigCnfType::NONE)
    craig_cnfs.push_back ({&craig_cnf_dual_sym, craig_cnf_type_dual_sym});
  if (craig_cnf_type_dual_asym != CraigCnfType::NONE)
    craig_cnfs.push_back ({&craig_cnf_dual_asym, craig_cnf_type_dual_asym});

  if (craig_cnfs.size () == 0) {
    return CraigCnfType::NONE;
  } else if (craig_cnfs.size () == 1) {
    cnf = std::move (*std::get<0> (craig_cnfs[0]));
    return std::get<1> (craig_cnfs[0]);
  }

  // We have at least two Craig interpolants for the following computations.
  if (interpolant == CraigInterpolant::UNION) {
    bool allConstantOne = true;
    for (auto &it : craig_cnfs) {
      if (std::get<1> (it) == CraigCnfType::CONSTANT0) {
        cnf = std::move (*std::get<0> (it));
        return CraigCnfType::CONSTANT0;
      }
      allConstantOne &= (std::get<1> (it) == CraigCnfType::CONSTANT1);
    }
    if (allConstantOne) {
      cnf = {};
      return CraigCnfType::CONSTANT1;
    }

    // Create trigger (t) that enforces all CNF parts.
    int craig_trigger = nextFreeVariable++;
    std::vector<int> craig_trigger_clause{craig_trigger};
    for (auto &it : craig_cnfs) {
      if (std::get<1> (it) == CraigCnfType::NORMAL) {
        size_t i = 0, j = cnf.size ();
        cnf.resize (cnf.size () + std::get<0> (it)->size ());
        for (; i < std::get<0> (it)->size () - 1u; i++, j++)
          cnf[j] = std::move ((*std::get<0> (it))[i]);
        // The positive trigger implies that all CNF parts are enabled: (t
        // -> t_1) = (-t v t_1)
        cnf[j] = {-craig_trigger, (*std::get<0> (it))[i][0]};
        // The negative trigger implies that at least one of the CNF parts
        // is not enabled: (-t -> (-t_1 v ... v -t_n)) = (t v -t_1 v ...
        // -t_n)
        craig_trigger_clause.push_back (-(*std::get<0> (it))[i][0]);
      }
    }

    cnf.push_back (craig_trigger_clause);
    cnf.push_back ({craig_trigger});

    return CraigCnfType::NORMAL;
  } else if (interpolant == CraigInterpolant::INTERSECTION) {
    bool allConstantZero = true;
    for (auto &it : craig_cnfs) {
      if (std::get<1> (it) == CraigCnfType::CONSTANT1) {
        cnf = std::move (*std::get<0> (it));
        return CraigCnfType::CONSTANT1;
      }
      allConstantZero &= (std::get<1> (it) == CraigCnfType::CONSTANT0);
    }
    if (allConstantZero) {
      cnf = {{}};
      return CraigCnfType::CONSTANT0;
    }

    // Create trigger (t) that enforces all CNF parts.
    int craig_trigger = nextFreeVariable++;
    std::vector<int> craig_trigger_clause{-craig_trigger};
    for (auto &it : craig_cnfs) {
      if (std::get<1> (it) == CraigCnfType::NORMAL) {
        size_t i = 0, j = cnf.size ();
        cnf.resize (cnf.size () + std::get<0> (it)->size ());
        for (; i < std::get<0> (it)->size () - 1u; i++, j++)
          cnf[j] = std::move ((*std::get<0> (it))[i]);
        // The positive trigger implies that one of the CNF parts is
        // enabled: (t -> (t_1 v ... v t_n)) = (-t v t_1 v ... t_n)
        craig_trigger_clause.push_back ((*std::get<0> (it))[i][0]);
        // The negative trigger implies that at all CNF parts are not
        // enabled: (-t -> -t_1) = (t v -t_1)
        cnf[j] = {craig_trigger, -(*std::get<0> (it))[i][0]};
      }
    }

    cnf.push_back (craig_trigger_clause);
    cnf.push_back ({craig_trigger});

    return CraigCnfType::NORMAL;
  } else if (interpolant == CraigInterpolant::SMALLEST) {
    auto compare = [] (const std::tuple<std::vector<std::vector<int>> *,
                                        CraigCnfType> &elem1,
                       const std::tuple<std::vector<std::vector<int>> *,
                                        CraigCnfType> &elem2) {
      return (std::get<0> (elem1)->size () < std::get<0> (elem2)->size ());
    };
    auto minimum =
        std::min_element (craig_cnfs.begin (), craig_cnfs.end (), compare);
    cnf = std::move (*std::get<0> (*minimum));
    return std::get<1> (*minimum);
  } else if (interpolant == CraigInterpolant::LARGEST) {
    auto compare = [] (const std::tuple<std::vector<std::vector<int>> *,
                                        CraigCnfType> &elem1,
                       const std::tuple<std::vector<std::vector<int>> *,
                                        CraigCnfType> &elem2) {
      return (std::get<0> (elem1)->size () < std::get<0> (elem2)->size ());
    };
    auto maximum =
        std::max_element (craig_cnfs.begin (), craig_cnfs.end (), compare);
    cnf = std::move (*std::get<0> (*maximum));
    return std::get<1> (*maximum);
  } else {
    assert (false); // Seleted craig interpolation type not supported!
    __builtin_unreachable ();
  }
}